

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::
FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>::
UntypedPerformAction
          (FunctionMockerBase<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>
           *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<BasicTestExpr<2>_> *pAVar1;
  Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> action;
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>_>
  local_20;
  
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>(mp::expr::Kind,BasicTestExpr<1>,TestCountExpr)>>
  ::copy<testing::ActionInterface<BasicTestExpr<2>(mp::expr::Kind,BasicTestExpr<1>,TestCountExpr)>>
            ((linked_ptr<testing::ActionInterface<BasicTestExpr<2>(mp::expr::Kind,BasicTestExpr<1>,TestCountExpr)>>
              *)&local_20,
             (linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>_>
              *)untyped_action);
  pAVar1 = ActionResultHolder<BasicTestExpr<2>>::
           PerformAction<BasicTestExpr<2>(mp::expr::Kind,BasicTestExpr<1>,TestCountExpr)>
                     ((Action<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)> *)
                      &local_20,(ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<BasicTestExpr<2>_(mp::expr::Kind,_BasicTestExpr<1>,_TestCountExpr)>_>
  ::~linked_ptr(&local_20);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }